

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O2

void __thiscall
JsUtil::CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler>::Add
          (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *this,
          EvalMapStringInternal<false> *value)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = Contains(this,value);
  if (!bVar1) {
    Js::EvalMapStringInternal<false>::operator=(this->entries + this->writeIndex,value);
    uVar2 = (this->writeIndex + 1) % 0xf;
    if ((uVar2 < this->writeIndex) && (this->filled == false)) {
      this->filled = true;
    }
    this->writeIndex = uVar2;
  }
  return;
}

Assistant:

void Add(const T& value)
        {
            if (!Contains(value))
            {
                entries[writeIndex] = value;
                uint nextIndex = (writeIndex + 1) % size;
                if (nextIndex < writeIndex && !filled)
                {
                    filled = true;
                }

                writeIndex = nextIndex;
            }
        }